

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_tool(int argc,char **argv)

{
  mcpl_outfile_t target;
  mcpl_outfile_t target_00;
  mcpl_file_t source;
  uint uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  mcpl_particle_t *pmVar5;
  size_t sVar6;
  char *__dest;
  mcpl_file_t mVar7;
  FILE *__stream;
  uint64_t uVar8;
  long in_RSI;
  int in_EDI;
  undefined8 in_R9;
  int parts;
  char *data;
  uint32_t ldata;
  mcpl_file_t mcplfile;
  uint64_t idx;
  mcpl_particle_t *p;
  FILE *fout;
  mcpl_file_t fi_1;
  char *fo_filename;
  size_t nn;
  char *outfile_fn;
  mcpl_particle_t *particle;
  uint64_t added;
  uint64_t left;
  int64_t pdgcode64;
  int32_t pdgcode_select;
  char comment [1024];
  uint64_t fi_nparticles;
  mcpl_outfile_t fo;
  mcpl_file_t fi;
  mcpl_outfile_t mf;
  int attempt_gzip;
  size_t lfn;
  char *outfn;
  int ifirstinfile;
  int any_textopts;
  int any_mergeopts;
  int any_extractopts;
  int any_dumpopts;
  int number_dumpopts;
  char *lo_keepuserflags;
  char *lo_forcemerge;
  char *lo_text;
  char *lo_version;
  char *lo_repair;
  char *lo_fakeversion;
  char *lo_preventcomment;
  char *lo_extract;
  char *lo_inplace;
  char *lo_merge;
  char *lo_nohead;
  char *lo_justhead;
  char *lo_help;
  size_t j;
  int64_t *consume_digit;
  size_t n;
  char *a;
  int i;
  int opt_fakeversion;
  int opt_text;
  int opt_version;
  int opt_repair;
  int opt_preventcomment;
  int opt_extract;
  int opt_inplace;
  int opt_keepuserflags;
  int opt_forcemerge;
  int opt_merge;
  int64_t opt_num_skip;
  int64_t opt_num_limit;
  int opt_nohead;
  int opt_justhead;
  char *pdgcode_str;
  char *blobkey;
  char **filenames;
  int nfilenames;
  char *in_stack_fffffffffffff9e8;
  mcpl_outfile_t in_stack_fffffffffffff9f0;
  char **in_stack_fffffffffffff9f8;
  mcpl_outfile_t in_stack_fffffffffffffa00;
  mcpl_file_t in_stack_fffffffffffffa08;
  mcpl_file_t in_stack_fffffffffffffa10;
  undefined6 in_stack_fffffffffffffa18;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  uint in_stack_fffffffffffffa34;
  mcpl_file_t in_stack_fffffffffffffa38;
  undefined8 in_stack_fffffffffffffa40;
  char **in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  uint uVar11;
  char *in_stack_fffffffffffffa58;
  FILE *__stream_00;
  char *in_stack_fffffffffffffa68;
  char *in_stack_fffffffffffffa70;
  long local_578;
  long local_570;
  long local_568;
  int local_55c;
  char local_558 [1032];
  uint64_t local_150;
  mcpl_outfile_t local_148;
  mcpl_file_t local_140;
  void *local_138;
  int local_12c;
  size_t local_128;
  char *local_120;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  int local_104;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  ulong local_98;
  long *local_90;
  size_t local_88;
  char *local_80;
  uint local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  long local_40;
  int local_38;
  int local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_14 = 0;
  local_20 = (char *)0x0;
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_34 = 0;
  local_38 = 0;
  local_40 = -1;
  local_48 = -1;
  local_4c = 0;
  local_50 = 0;
  local_54 = 0;
  local_58 = 0;
  local_5c = 0;
  local_60 = 0;
  local_64 = 0;
  local_68 = 0;
  local_6c = 0;
  local_70 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  for (local_74 = 1; (int)local_74 < local_8; local_74 = local_74 + 1) {
    local_80 = *(char **)(local_10 + (long)(int)local_74 * 8);
    local_88 = strlen(local_80);
    if (local_88 != 0) {
      if (((local_88 < 2) || (*local_80 != '-')) || (local_80[1] == '-')) {
        if (((local_88 < 3) || (*local_80 != '-')) || (local_80[1] != '-')) {
          if ((local_88 == 0) || (*local_80 == '-')) {
            free(local_20);
            iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                    (char *)in_stack_fffffffffffff9f0.internal);
            return iVar2;
          }
          if (local_20 == (char *)0x0) {
            local_20 = mcpl_internal_calloc
                                 ((size_t)in_stack_fffffffffffffa10.internal,
                                  (size_t)in_stack_fffffffffffffa08.internal);
          }
          *(char **)(local_20 + (long)local_14 * 8) = local_80;
          local_14 = local_14 + 1;
        }
        else {
          local_80 = local_80 + 2;
          local_a0 = "help";
          local_a8 = "justhead";
          local_b0 = "nohead";
          local_b8 = "merge";
          local_c0 = "inplace";
          local_c8 = "extract";
          local_d0 = "preventcomment";
          local_d8 = "fakeversion";
          local_e0 = "repair";
          local_e8 = "version";
          local_f0 = "text";
          local_f8 = "forcemerge";
          local_100 = "keepuserflags";
          pcVar4 = strstr("help",local_80);
          if (pcVar4 == local_a0) {
            free(local_20);
            iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                    (char *)in_stack_fffffffffffff9f0.internal);
            return iVar2;
          }
          pcVar4 = strstr(local_a8,local_80);
          if (pcVar4 == local_a8) {
            local_34 = 1;
          }
          else {
            pcVar4 = strstr(local_b0,local_80);
            if (pcVar4 == local_b0) {
              local_38 = 1;
            }
            else {
              pcVar4 = strstr(local_b8,local_80);
              if (pcVar4 == local_b8) {
                local_4c = 1;
              }
              else {
                pcVar4 = strstr(local_f8,local_80);
                if (pcVar4 == local_f8) {
                  local_50 = 1;
                }
                else {
                  pcVar4 = strstr(local_100,local_80);
                  if (pcVar4 == local_100) {
                    local_54 = 1;
                  }
                  else {
                    pcVar4 = strstr(local_c0,local_80);
                    if (pcVar4 == local_c0) {
                      local_58 = 1;
                    }
                    else {
                      pcVar4 = strstr(local_c8,local_80);
                      if (pcVar4 == local_c8) {
                        local_5c = 1;
                      }
                      else {
                        pcVar4 = strstr(local_e0,local_80);
                        if (pcVar4 == local_e0) {
                          local_64 = 1;
                        }
                        else {
                          pcVar4 = strstr(local_e8,local_80);
                          if (pcVar4 == local_e8) {
                            local_68 = 1;
                          }
                          else {
                            pcVar4 = strstr(local_d0,local_80);
                            if (pcVar4 == local_d0) {
                              local_60 = 1;
                            }
                            else {
                              pcVar4 = strstr(local_d8,local_80);
                              if (pcVar4 == local_d8) {
                                local_70 = 1;
                              }
                              else {
                                pcVar4 = strstr(local_f0,local_80);
                                if (pcVar4 != local_f0) {
                                  free(local_20);
                                  iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                                          (char *)in_stack_fffffffffffff9f0.internal
                                                         );
                                  return iVar2;
                                }
                                local_6c = 1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        local_90 = (long *)0x0;
        for (local_98 = 1; local_98 < local_88; local_98 = local_98 + 1) {
          if (local_90 == (long *)0x0) {
            if (local_80[local_98] == 'b') {
              if (local_28 != (char *)0x0) {
                free(local_20);
                iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                        (char *)in_stack_fffffffffffff9f0.internal);
                return iVar2;
              }
              if (local_98 + 1 == local_88) {
                free(local_20);
                iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                        (char *)in_stack_fffffffffffff9f0.internal);
                return iVar2;
              }
              local_28 = local_80 + local_98 + 1;
              break;
            }
            if (local_80[local_98] == 'p') {
              if (local_30 != (char *)0x0) {
                free(local_20);
                iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                        (char *)in_stack_fffffffffffff9f0.internal);
                return iVar2;
              }
              if (local_98 + 1 == local_88) {
                free(local_20);
                iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                        (char *)in_stack_fffffffffffff9f0.internal);
                return iVar2;
              }
              local_30 = local_80 + local_98 + 1;
              break;
            }
            switch(local_80[local_98]) {
            case 'e':
              local_5c = 1;
              break;
            default:
              free(local_20);
              iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                      (char *)in_stack_fffffffffffff9f0.internal);
              return iVar2;
            case 'h':
              free(local_20);
              iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                      (char *)in_stack_fffffffffffff9f0.internal);
              return iVar2;
            case 'j':
              local_34 = 1;
              break;
            case 'l':
              local_90 = &local_40;
              break;
            case 'm':
              local_4c = 1;
              break;
            case 'n':
              local_38 = 1;
              break;
            case 'r':
              local_64 = 1;
              break;
            case 's':
              local_90 = &local_48;
              break;
            case 't':
              local_6c = 1;
              break;
            case 'v':
              local_68 = 1;
            }
            if ((local_90 != (long *)0x0) && (*local_90 = 0, local_98 + 1 == local_88)) {
              free(local_20);
              iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                      (char *)in_stack_fffffffffffff9f0.internal);
              return iVar2;
            }
          }
          else {
            if ((local_80[local_98] < '0') || ('9' < local_80[local_98])) {
              free(local_20);
              iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                      (char *)in_stack_fffffffffffff9f0.internal);
              return iVar2;
            }
            *local_90 = *local_90 * 10;
            *local_90 = (long)(local_80[local_98] + -0x30) + *local_90;
          }
        }
      }
    }
  }
  if (local_70 != 0) {
    mcpl_internal_fakeconstantversion(1);
  }
  uVar11 = (uint)((ulong)in_stack_fffffffffffffa50 >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
  if ((local_5c == 0) && (local_30 != (char *)0x0)) {
    free(local_20);
    local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0.internal);
  }
  else if ((local_4c == 0) && (local_58 != 0)) {
    free(local_20);
    local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0.internal);
  }
  else if ((local_50 == 0) && (local_54 != 0)) {
    free(local_20);
    local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0.internal);
  }
  else if ((local_4c == 0) || (local_50 == 0)) {
    local_104 = local_34 + local_38 + (uint)(local_28 != (char *)0x0);
    if (local_5c == 0) {
      local_104 = (uint)(local_40 != -1) + (uint)(local_48 != -1) + local_104;
    }
    local_108 = (uint)(local_104 != 0);
    uVar10 = local_5c != 0 || local_30 != (char *)0x0;
    local_10c = (uint)(byte)uVar10;
    uVar9 = local_4c != 0 || local_50 != 0;
    local_110 = (uint)(byte)uVar9;
    local_114 = (uint)(local_6c != 0);
    if ((int)(local_108 + local_110 + local_10c + local_114 + local_64 + local_68) < 2) {
      if ((local_28 == (char *)0x0) || (local_104 < 2)) {
        if (local_68 == 0) {
          if (local_110 == 0) {
            if (local_5c == 0) {
              if (local_6c == 0) {
                if (local_14 < 2) {
                  if (local_14 == 0) {
                    free(local_20);
                    local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                              (char *)in_stack_fffffffffffff9f0.internal);
                  }
                  else if (local_64 == 0) {
                    if (local_28 == (char *)0x0) {
                      if ((local_34 == 0) || ((local_40 == -1 && (local_48 == -1)))) {
                        if (local_40 < 0) {
                          local_40 = 10;
                        }
                        if (local_48 < 0) {
                          local_48 = 0;
                        }
                        if ((local_34 == 0) || (local_38 == 0)) {
                          mcpl_dump((char *)in_stack_fffffffffffffa10.internal,
                                    (int)((ulong)in_stack_fffffffffffffa08.internal >> 0x20),
                                    (uint64_t)in_stack_fffffffffffffa00.internal,
                                    (uint64_t)in_stack_fffffffffffff9f8);
                          free(local_20);
                          local_4 = 0;
                        }
                        else {
                          free(local_20);
                          local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                                    (char *)in_stack_fffffffffffff9f0.internal);
                        }
                      }
                      else {
                        free(local_20);
                        local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                                  (char *)in_stack_fffffffffffff9f0.internal);
                      }
                    }
                    else {
                      mcpl_open_file(in_stack_fffffffffffff9e8);
                      iVar2 = mcpl_hdr_blob(in_stack_fffffffffffffa08,
                                            (char *)in_stack_fffffffffffffa00.internal,
                                            (uint32_t *)in_stack_fffffffffffff9f8,
                                            (char **)in_stack_fffffffffffff9f0.internal);
                      if (iVar2 == 0) {
                        mcpl_close_file((mcpl_file_t)in_stack_fffffffffffff9f0.internal);
                        local_4 = 1;
                      }
                      else {
                        mcpl_internal_dump_to_stdout
                                  ((char *)in_stack_fffffffffffff9f0.internal,
                                   (unsigned_long)in_stack_fffffffffffff9e8);
                        free(local_20);
                        mcpl_close_file((mcpl_file_t)in_stack_fffffffffffff9f0.internal);
                        local_4 = 0;
                      }
                    }
                  }
                  else {
                    mcpl_repair((char *)in_stack_fffffffffffffa10.internal);
                    free(local_20);
                    local_4 = 0;
                  }
                }
                else {
                  free(local_20);
                  local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                            (char *)in_stack_fffffffffffff9f0.internal);
                }
              }
              else if (local_14 < 3) {
                if (local_14 == 2) {
                  iVar2 = mcpl_file_certainly_exists((char *)in_stack_fffffffffffffa00.internal);
                  if (iVar2 == 0) {
                    mVar7 = mcpl_open_file(in_stack_fffffffffffff9e8);
                    __stream = (FILE *)mcpl_internal_fopen((char *)in_stack_fffffffffffffa00.
                                                                   internal,
                                                           (char *)in_stack_fffffffffffff9f8);
                    if (__stream == (FILE *)0x0) {
                      mcpl_close_file((mcpl_file_t)in_stack_fffffffffffff9f0.internal);
                      free(local_20);
                      local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                                (char *)in_stack_fffffffffffff9f0.internal);
                    }
                    else {
                      __stream_00 = __stream;
                      uVar8 = mcpl_hdr_nparticles(mVar7);
                      fprintf(__stream,
                              "#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %lu\n#END-HEADER\n",
                              uVar8);
                      fprintf(__stream_00,
                              "index     pdgcode               ekin[MeV]                   x[cm]                   y[cm]                   z[cm]                      ux                      uy                      uz                time[ms]                  weight                   pol-x                   pol-y                   pol-z  userflags\n"
                             );
                      while (pmVar5 = mcpl_read(in_stack_fffffffffffffa38),
                            pmVar5 != (mcpl_particle_t *)0x0) {
                        uVar8 = mcpl_currentposition(mVar7);
                        in_stack_fffffffffffff9f0.internal = (void *)pmVar5->polarisation[0];
                        fprintf(__stream_00,
                                "%5lu %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n"
                                ,pmVar5->ekin,pmVar5->position[0],pmVar5->position[1],
                                pmVar5->position[2],pmVar5->direction[0],pmVar5->direction[1],
                                pmVar5->direction[2],pmVar5->time,uVar8 - 1,
                                (ulong)(uint)pmVar5->pdgcode,(ulong)pmVar5->userflags,in_R9,
                                pmVar5->weight,in_stack_fffffffffffff9f0.internal,
                                pmVar5->polarisation[1],pmVar5->polarisation[2]);
                      }
                      fclose(__stream_00);
                      mcpl_close_file((mcpl_file_t)in_stack_fffffffffffff9f0.internal);
                      free(local_20);
                      local_4 = 0;
                    }
                  }
                  else {
                    free(local_20);
                    local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                              (char *)in_stack_fffffffffffff9f0.internal);
                  }
                }
                else {
                  free(local_20);
                  local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                            (char *)in_stack_fffffffffffff9f0.internal);
                }
              }
              else {
                free(local_20);
                local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                          (char *)in_stack_fffffffffffff9f0.internal);
              }
            }
            else if (local_14 < 3) {
              if (local_14 == 2) {
                iVar2 = mcpl_file_certainly_exists((char *)in_stack_fffffffffffffa00.internal);
                if (iVar2 == 0) {
                  local_140 = mcpl_open_file(in_stack_fffffffffffff9e8);
                  local_148 = mcpl_create_outfile((char *)in_stack_fffffffffffff9f8);
                  mVar7.internal._4_4_ = in_stack_fffffffffffffa34;
                  mVar7.internal._0_4_ = in_stack_fffffffffffffa30;
                  target.internal._4_4_ = in_stack_fffffffffffffa2c;
                  target.internal._0_4_ = in_stack_fffffffffffffa28;
                  mcpl_transfer_metadata(mVar7,target);
                  local_150 = mcpl_hdr_nparticles(local_140);
                  if (local_60 == 0) {
                    snprintf(local_558,0x400,
                             "mcpltool: extracted particles from file with %lu particles",local_150)
                    ;
                    mcpl_hdr_add_comment
                              (in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
                  }
                  local_55c = 0;
                  if (local_30 != (char *)0x0) {
                    iVar2 = mcpl_str2int((char *)CONCAT17(uVar10,CONCAT16(uVar9,
                                                  in_stack_fffffffffffffa18)),
                                         (size_t)in_stack_fffffffffffffa10.internal,
                                         (int64_t *)in_stack_fffffffffffffa08.internal);
                    if ((((iVar2 == 0) || (0x80000000 < -local_568)) || (0x7fffffff < local_568)) ||
                       (local_568 == 0)) {
                      free(local_20);
                      iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                              (char *)in_stack_fffffffffffff9f0.internal);
                      return iVar2;
                    }
                    local_55c = (int)local_568;
                  }
                  if (0 < local_48) {
                    mcpl_seek(in_stack_fffffffffffffa10,(uint64_t)in_stack_fffffffffffffa08.internal
                             );
                  }
                  local_570 = local_40;
                  if (local_40 < 1) {
                    local_570 = -1;
                  }
                  local_578 = 0;
                  while (local_570 != 0) {
                    local_570 = local_570 + -1;
                    pmVar5 = mcpl_read(in_stack_fffffffffffffa38);
                    if (pmVar5 == (mcpl_particle_t *)0x0) break;
                    if ((local_55c == 0) || (local_55c == pmVar5->pdgcode)) {
                      source.internal._4_4_ = in_stack_fffffffffffffa34;
                      source.internal._0_4_ = in_stack_fffffffffffffa30;
                      target_00.internal._4_4_ = in_stack_fffffffffffffa2c;
                      target_00.internal._0_4_ = in_stack_fffffffffffffa28;
                      mcpl_transfer_last_read_particle(source,target_00);
                      local_578 = local_578 + 1;
                    }
                  }
                  pcVar4 = mcpl_outfile_filename(local_148);
                  sVar6 = strlen(pcVar4);
                  __dest = mcpl_internal_malloc((size_t)in_stack_fffffffffffff9f0.internal);
                  memcpy(__dest,pcVar4,sVar6 + 1);
                  iVar2 = mcpl_closeandgzip_outfile(in_stack_fffffffffffffa00);
                  if (iVar2 != 0) {
                    builtin_strncpy(__dest + sVar6,".gz",4);
                  }
                  mcpl_close_file((mcpl_file_t)in_stack_fffffffffffff9f0.internal);
                  printf("MCPL: Successfully extracted %lu / %lu particles from %s into %s\n",
                         local_578,local_150,*(undefined8 *)local_20,__dest);
                  free(__dest);
                  free(local_20);
                  local_4 = 0;
                }
                else {
                  free(local_20);
                  local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                            (char *)in_stack_fffffffffffff9f0.internal);
                }
              }
              else {
                free(local_20);
                local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                          (char *)in_stack_fffffffffffff9f0.internal);
              }
            }
            else {
              free(local_20);
              local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                        (char *)in_stack_fffffffffffff9f0.internal);
            }
          }
          else if (local_14 < 2) {
            free(local_20);
            local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                      (char *)in_stack_fffffffffffff9f0.internal);
          }
          else {
            local_118 = (uint)(local_58 == 0);
            uVar1 = local_118;
            if (local_50 == 0) {
              do {
                uVar11 = (uint)((ulong)in_stack_fffffffffffffa50 >> 0x20);
                iVar2 = (int)((ulong)in_stack_fffffffffffffa40 >> 0x20);
                local_74 = uVar1 + 1;
                if (local_14 <= (int)local_74) goto LAB_00109437;
                iVar2 = mcpl_can_merge((char *)in_stack_fffffffffffffa00.internal,
                                       (char *)in_stack_fffffffffffff9f8);
                uVar1 = local_74;
              } while (iVar2 != 0);
              free(local_20);
              local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                        (char *)in_stack_fffffffffffff9f0.internal);
            }
            else {
LAB_00109437:
              if (local_58 == 0) {
                iVar3 = mcpl_file_certainly_exists((char *)in_stack_fffffffffffffa00.internal);
                if (iVar3 != 0) {
                  free(local_20);
                  iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                          (char *)in_stack_fffffffffffff9f0.internal);
                  return iVar2;
                }
                local_120 = *(char **)local_20;
                local_128 = strlen(local_120);
                local_12c = 0;
                if ((local_128 < 9) ||
                   (iVar3 = strcmp(local_120 + (local_128 - 8),".mcpl.gz"), iVar3 != 0)) {
                  if ((3 < local_128) &&
                     (iVar3 = strcmp(local_120 + (local_128 - 3),".gz"), iVar3 == 0)) {
                    free(local_20);
                    iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                            (char *)in_stack_fffffffffffff9f0.internal);
                    return iVar2;
                  }
                }
                else {
                  local_12c = 1;
                  local_120 = mcpl_internal_malloc((size_t)in_stack_fffffffffffff9f0.internal);
                  memcpy(local_120,*(void **)local_20,local_128 - 3);
                  local_120[local_128 - 3] = '\0';
                  iVar3 = mcpl_file_certainly_exists((char *)in_stack_fffffffffffffa00.internal);
                  if (iVar3 != 0) {
                    free(local_20);
                    iVar2 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                            (char *)in_stack_fffffffffffff9f0.internal);
                    return iVar2;
                  }
                }
                if (local_50 == 0) {
                  local_138 = (void *)mcpl_merge_files(in_stack_fffffffffffffa38.internal,
                                                       in_stack_fffffffffffffa34,
                                                       (char **)CONCAT44(in_stack_fffffffffffffa2c,
                                                                         in_stack_fffffffffffffa28))
                  ;
                }
                else {
                  local_138 = (void *)mcpl_forcemerge_files
                                                (in_stack_fffffffffffffa58,uVar11,
                                                 in_stack_fffffffffffffa48,iVar2);
                }
                if (local_12c == 0) {
                  mcpl_close_outfile(in_stack_fffffffffffff9f0);
                }
                else {
                  iVar2 = mcpl_closeandgzip_outfile(in_stack_fffffffffffffa00);
                  if (iVar2 == 0) {
                    printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n"
                           ,local_120);
                  }
                }
                if (local_120 != *(char **)local_20) {
                  free(local_120);
                }
              }
              else {
                if ((local_50 != 0) || (uVar11 = local_118, local_4c == 0)) {
                  mcpl_error((char *)0x109465);
                  uVar11 = local_118;
                }
                while (local_74 = uVar11 + 1, (int)local_74 < local_14) {
                  mcpl_merge_inplace(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
                  uVar11 = local_74;
                }
              }
              free(local_20);
              local_4 = 0;
            }
          }
        }
        else {
          free(local_20);
          if (local_14 == 0) {
            iVar2 = mcpl_internal_fakeconstantversion(0);
            if (iVar2 == 0) {
              printf("MCPL version 2.0.0\n");
            }
            else {
              printf("MCPL version 99.99.99\n");
            }
            local_4 = 0;
          }
          else {
            local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                      (char *)in_stack_fffffffffffff9f0.internal);
          }
        }
      }
      else {
        free(local_20);
        local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,
                                  (char *)in_stack_fffffffffffff9f0.internal);
      }
    }
    else {
      free(local_20);
      local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0.internal
                               );
    }
  }
  else {
    free(local_20);
    local_4 = mcpl_tool_usage(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0.internal);
  }
  return local_4;
}

Assistant:

int mcpl_tool(int argc,char** argv) {

  int nfilenames = 0;
  char ** filenames = NULL;
  const char * blobkey = NULL;
  const char * pdgcode_str = NULL;
  int opt_justhead = 0;
  int opt_nohead = 0;
  int64_t opt_num_limit = -1;
  int64_t opt_num_skip = -1;
  int opt_merge = 0;
  int opt_forcemerge = 0;
  int opt_keepuserflags = 0;
  int opt_inplace = 0;
  int opt_extract = 0;
  int opt_preventcomment = 0;//undocumented unoffical flag for mcpl unit tests
  int opt_repair = 0;
  int opt_version = 0;
  int opt_text = 0;
  int opt_fakeversion = 0;//undocumented unoffical flag for mcpl unit tests

  int i;
  for (i = 1; i<argc; ++i) {
    char * a = argv[i];
    size_t n=strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = NULL;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9') {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: expected number");
          }
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        if (a[j]=='b') {
          if (blobkey) {
            free(filenames);
            return mcpl_tool_usage(argv,"-b specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -b");
          }
          blobkey = a+j+1;
          break;
        }
        if (a[j]=='p') {
          if (pdgcode_str) {
            free(filenames);
            return mcpl_tool_usage(argv,"-p specified more than once");
          }
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Missing argument for -p");
          }
          pdgcode_str = a+j+1;
          break;
        }

        switch(a[j]) {
        case 'h':
          {
            free(filenames);
            return mcpl_tool_usage(argv,0);
          }
        case 'j': opt_justhead = 1; break;
        case 'n': opt_nohead = 1; break;
        case 'm': opt_merge = 1; break;
        case 'e': opt_extract = 1; break;
        case 'r': opt_repair = 1; break;
        case 'v': opt_version = 1; break;
        case 't': opt_text = 1; break;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_skip; break;
        default:
          {
            free(filenames);
            return mcpl_tool_usage(argv,"Unrecognised option");
          }
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n) {
            free(filenames);
            return mcpl_tool_usage(argv,"Bad option: missing number");
          }
        }
      }
    } else if (n>=3&&a[0]=='-'&&a[1]=='-') {
      a+=2;
      //long options:
      const char * lo_help = "help";
      const char * lo_justhead = "justhead";
      const char * lo_nohead = "nohead";
      const char * lo_merge = "merge";
      const char * lo_inplace = "inplace";
      const char * lo_extract = "extract";
      const char * lo_preventcomment = "preventcomment";
      const char * lo_fakeversion = "fakeversion";
      const char * lo_repair = "repair";
      const char * lo_version = "version";
      const char * lo_text = "text";
      const char * lo_forcemerge = "forcemerge";
      const char * lo_keepuserflags = "keepuserflags";
      //Use strstr instead of "strcmp(a,"--help")==0" to support shortened
      //versions (works since all our long-opts start with unique char).
      if (strstr(lo_help,a)==lo_help) return free(filenames), mcpl_tool_usage(argv,0);
      else if (strstr(lo_justhead,a)==lo_justhead) opt_justhead = 1;
      else if (strstr(lo_nohead,a)==lo_nohead) opt_nohead = 1;
      else if (strstr(lo_merge,a)==lo_merge) opt_merge = 1;
      else if (strstr(lo_forcemerge,a)==lo_forcemerge) opt_forcemerge = 1;
      else if (strstr(lo_keepuserflags,a)==lo_keepuserflags) opt_keepuserflags = 1;
      else if (strstr(lo_inplace,a)==lo_inplace) opt_inplace = 1;
      else if (strstr(lo_extract,a)==lo_extract) opt_extract = 1;
      else if (strstr(lo_repair,a)==lo_repair) opt_repair = 1;
      else if (strstr(lo_version,a)==lo_version) opt_version = 1;
      else if (strstr(lo_preventcomment,a)==lo_preventcomment) opt_preventcomment = 1;
      else if (strstr(lo_fakeversion,a)==lo_fakeversion) opt_fakeversion = 1;
      else if (strstr(lo_text,a)==lo_text) opt_text = 1;
      else return free(filenames),mcpl_tool_usage(argv,"Unrecognised option");
    } else if (n>=1&&a[0]!='-') {
      //input file
      if (!filenames)
        filenames = (char **)mcpl_internal_calloc(argc,sizeof(char*));
      filenames[nfilenames] = a;
      ++nfilenames;
    } else {
      return free(filenames),mcpl_tool_usage(argv,"Bad arguments");
    }
  }

  if ( opt_fakeversion )
    mcpl_internal_fakeconstantversion(1);

  if ( opt_extract==0 && pdgcode_str )
    return free(filenames),mcpl_tool_usage(argv,"-p can only be used with --extract.");

  if ( opt_merge==0 && opt_inplace!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--inplace can only be used with --merge.");

  if ( opt_forcemerge==0 && opt_keepuserflags!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--keepuserflags can only be used with --forcemerge.");

  if ( opt_merge!=0 && opt_forcemerge!=0 )
    return free(filenames),mcpl_tool_usage(argv,"--merge and --forcemerge can not both be specified .");

  int number_dumpopts = (opt_justhead + opt_nohead + (blobkey!=0));
  if (opt_extract==0)
    number_dumpopts += (opt_num_limit!=-1) + (opt_num_skip!=-1);
  int any_dumpopts = number_dumpopts != 0;
  int any_extractopts = (opt_extract!=0||pdgcode_str!=0);
  int any_mergeopts = (opt_merge!=0||opt_forcemerge!=0);
  int any_textopts = (opt_text!=0);
  if (any_dumpopts+any_mergeopts+any_extractopts+any_textopts+opt_repair+opt_version>1)
    return free(filenames),mcpl_tool_usage(argv,"Conflicting options specified.");

  if (blobkey&&(number_dumpopts>1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify other dump options with -b.");

  if (opt_version) {
    free(filenames);
    if (nfilenames)
      return mcpl_tool_usage(argv,"Unrecognised arguments for --version.");

    if ( mcpl_internal_fakeconstantversion(0) )
      printf("MCPL version " "99.99.99" "\n");
    else
      printf("MCPL version " MCPL_VERSION_STR "\n");
    return 0;
  }

  if (any_mergeopts) {

    if (nfilenames<2)
      return free(filenames),mcpl_tool_usage(argv,
                                             (opt_forcemerge?"Too few arguments for --forcemerge.":"Too few arguments for --merge.") );

    int ifirstinfile = (opt_inplace ? 0 : 1);
    if (!opt_forcemerge) {
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        if (!mcpl_can_merge(filenames[ifirstinfile],filenames[i]))
          return free(filenames),mcpl_tool_usage(argv,"Requested files are incompatible for merge as they have different header info.");
    }

    if (opt_inplace) {
      if ( ! ( !opt_forcemerge && opt_merge) )
        mcpl_error("logic error in argument parsing");
      for (i = ifirstinfile+1; i < nfilenames; ++i)
        mcpl_merge_inplace(filenames[ifirstinfile],filenames[i]);
    } else {
      if (mcpl_file_certainly_exists(filenames[0]))
        return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

      //Disallow .gz endings unless it is .mcpl.gz, in which case we attempt to gzip automatically.
      char * outfn = filenames[0];
      size_t lfn = strlen(outfn);
      int attempt_gzip = 0;
      if( lfn > 8 && !strcmp(outfn + (lfn - 8), ".mcpl.gz")) {
        attempt_gzip = 1;
        outfn = mcpl_internal_malloc(lfn-2);//lfn+1-3
        memcpy(outfn,filenames[0],lfn-3);
        outfn[lfn-3] = '\0';
        if (mcpl_file_certainly_exists(outfn))
          return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists (without .gz extension).");
      } else if( lfn > 3 && !strcmp(outfn + (lfn - 3), ".gz")) {
        return free(filenames),mcpl_tool_usage(argv,"Requested output file should not have .gz extension (unless it is .mcpl.gz).");
      }

      mcpl_outfile_t mf = ( opt_forcemerge ?
                            mcpl_forcemerge_files( outfn, nfilenames-1, (const char**)filenames + 1, opt_keepuserflags) :
                            mcpl_merge_files( outfn, nfilenames-1, (const char**)filenames + 1) );
      if (attempt_gzip) {
        if (!mcpl_closeandgzip_outfile(mf))
          printf("MCPL WARNING: Failed to gzip output. Non-gzipped output is found in %s\n",outfn);
      } else {
        mcpl_close_outfile(mf);
      }
      if (outfn != filenames[0])
        free(outfn);
    }

    free(filenames);
    return 0;
  }

  if (opt_extract) {
    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --extract.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    mcpl_outfile_t fo = mcpl_create_outfile(filenames[1]);
    mcpl_transfer_metadata(fi, fo);
    uint64_t fi_nparticles = mcpl_hdr_nparticles(fi);

    if (!opt_preventcomment) {
      char comment[1024];
      snprintf(comment, sizeof(comment), "mcpltool: extracted particles from"
               " file with %" PRIu64 " particles",fi_nparticles);
      mcpl_hdr_add_comment(fo,comment);
    }

    int32_t pdgcode_select = 0;
    if (pdgcode_str) {
      int64_t pdgcode64;
      if (!mcpl_str2int(pdgcode_str, 0, &pdgcode64) || -pdgcode64>2147483648 || pdgcode64>2147483647 || !pdgcode64)
        return free(filenames),mcpl_tool_usage(argv,"Must specify non-zero 32bit integer as argument to -p.");
      pdgcode_select = (int32_t)pdgcode64;
    }

    if (opt_num_skip>0)
      mcpl_seek(fi,(uint64_t)opt_num_skip);

    //uint64_t(-1) instead of UINT64_MAX to fix clang c++98 compilation
    uint64_t left = opt_num_limit>0 ? (uint64_t)opt_num_limit : (uint64_t)-1;
    uint64_t added = 0;

    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    for (;left;) {
      --left;
      const mcpl_particle_t* particle = mcpl_read(fi);
      if (!particle)
        break;
      if (pdgcode_select && pdgcode_select!= particle->pdgcode)
        continue;
      mcpl_transfer_last_read_particle(fi, fo);//Doing mcpl_add_particle(fo,particle) is potentially (very rarely) lossy
      ++added;
    }

    const char * outfile_fn = mcpl_outfile_filename(fo);
    size_t nn = strlen(outfile_fn);
    char *fo_filename = mcpl_internal_malloc(nn+4);
    //fo_filename[0] = '\0';
    memcpy(fo_filename,outfile_fn,nn+1);
    //memcpy(fo_filename+nn,".gz",4);
    //  strncat(fo_filename,mcpl_outfile_filename(fo),nn);
    if (mcpl_closeandgzip_outfile(fo))
      memcpy(fo_filename+nn,".gz",4);
    //strncat(fo_filename,".gz",3);
    mcpl_close_file(fi);

    printf("MCPL: Successfully extracted %" PRIu64 " / %" PRIu64 " particles from %s into %s\n",
           added,fi_nparticles,filenames[0],fo_filename);
    free(fo_filename);
    free(filenames);
    return 0;
  }

  if (opt_text) {

    if (nfilenames>2)
      return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

    if (nfilenames!=2)
      return free(filenames),mcpl_tool_usage(argv,"Must specify both input and output files with --text.");

    if (mcpl_file_certainly_exists(filenames[1]))
      return free(filenames),mcpl_tool_usage(argv,"Requested output file already exists.");

    mcpl_file_t fi = mcpl_open_file(filenames[0]);
    FILE * fout = mcpl_internal_fopen(filenames[1],"w");
    if (!fout) {
      mcpl_close_file(fi);
      free(filenames);
      return mcpl_tool_usage(argv,"Could not open output file.");
    }

    fprintf(fout,"#MCPL-ASCII\n#ASCII-FORMAT: v1\n#NPARTICLES: %" PRIu64 "\n#END-HEADER\n",mcpl_hdr_nparticles(fi));
    fprintf(fout,"index     pdgcode               ekin[MeV]                   x[cm]          "
            "         y[cm]                   z[cm]                      ux                  "
            "    uy                      uz                time[ms]                  weight  "
            "                 pol-x                   pol-y                   pol-z  userflags\n");
    //Writing the next loop in an annoying way to silence MSVC C4706 warning:
    while (1) {
      const mcpl_particle_t* p = mcpl_read(fi);
      if (!p)
        break;
      uint64_t idx = mcpl_currentposition(fi)-1;//-1 since mcpl_read skipped ahead
      fprintf( fout,"%5" PRIu64
               " %11i %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g %23.18g"
               " %23.18g %23.18g %23.18g %23.18g %23.18g 0x%08x\n",
               idx,p->pdgcode,p->ekin,p->position[0],p->position[1],p->position[2],
               p->direction[0],p->direction[1],p->direction[2],p->time,p->weight,
               p->polarisation[0],p->polarisation[1],p->polarisation[2],p->userflags);
    }
    fclose(fout);
    mcpl_close_file(fi);
    free(filenames);
    return 0;
  }

  if (nfilenames>1)
    return free(filenames),mcpl_tool_usage(argv,"Too many arguments.");

  if (!nfilenames)
    return free(filenames),mcpl_tool_usage(argv,"No input file specified");

  if (opt_repair) {
    mcpl_repair(filenames[0]);
    free(filenames);
    return 0;
  }

  //Dump mode:
  if (blobkey) {
    mcpl_file_t mcplfile = mcpl_open_file(filenames[0]);
    uint32_t ldata;
    const char * data;
    if (!mcpl_hdr_blob(mcplfile, blobkey, &ldata, &data)) {
      mcpl_close_file(mcplfile);
      return 1;
    }
    mcpl_internal_dump_to_stdout( data, ldata );
    free(filenames);
    mcpl_close_file(mcplfile);
    return 0;
  }

  if (opt_justhead&&(opt_num_limit!=-1||opt_num_skip!=-1))
    return free(filenames),mcpl_tool_usage(argv,"Do not specify -l or -s with --justhead");

  if (opt_num_limit<0) opt_num_limit = MCPLIMP_TOOL_DEFAULT_NLIMIT;
  if (opt_num_skip<0) opt_num_skip = MCPLIMP_TOOL_DEFAULT_NSKIP;

  if (opt_justhead&&opt_nohead)
    return free(filenames),mcpl_tool_usage(argv,"Do not supply both --justhead and --nohead.");

  int parts = 0;
  if (opt_nohead) parts=2;
  else if (opt_justhead) parts=1;
  mcpl_dump(filenames[0],parts,opt_num_skip,opt_num_limit);
  free(filenames);
  return 0;
}